

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveRight4update3sparse
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *eps,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs,int *ridx,int *rn,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          eps2,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *vec2,int *idx2,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs2,int *ridx2,int *rn2,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          eps3,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *vec3,int *idx3,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs3,int *ridx3,int *rn3,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *forest,int *forestNum,int *forestIdx)

{
  undefined8 *puVar1;
  uint *puVar2;
  bool bVar3;
  fpclass_type fVar4;
  int iVar5;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar6;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *vec_00;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  undefined4 uVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  uint local_414;
  cpp_dec_float<50U,_int,_void> local_408;
  int *local_3d0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3c8;
  int32_t local_3c0;
  int local_3bc;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  int *local_388;
  int *local_380;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_378;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_370;
  cpp_dec_float<50U,_int,_void> local_368;
  cpp_dec_float<50U,_int,_void> local_328;
  cpp_dec_float<50U,_int,_void> local_2e8;
  cpp_dec_float<50U,_int,_void> local_2a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_268;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_228;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  local_68.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
  local_68.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
  local_68.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
  local_68.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
  local_68.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
  local_68.m_backend.exp = (eps->m_backend).exp;
  local_68.m_backend.neg = (eps->m_backend).neg;
  local_68.m_backend.fpclass = (eps->m_backend).fpclass;
  local_68.m_backend.prec_elem = (eps->m_backend).prec_elem;
  local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend.data._M_elems._0_8_;
  local_a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 8);
  local_a8.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x10);
  local_a8.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x18);
  local_a8.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x20);
  local_a8.m_backend.exp = *(int *)(eps2.m_backend.data._M_elems._0_8_ + 0x28);
  local_a8.m_backend.neg = *(bool *)(eps2.m_backend.data._M_elems._0_8_ + 0x2c);
  local_a8.m_backend._48_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x30);
  local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend._48_8_;
  local_e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 8);
  local_e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 0x10);
  local_e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 0x18);
  local_e8.m_backend.data._M_elems._32_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 0x20);
  local_e8.m_backend.exp = *(int *)(eps2.m_backend._48_8_ + 0x28);
  local_e8.m_backend.neg = *(bool *)(eps2.m_backend._48_8_ + 0x2c);
  local_e8.m_backend._48_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 0x30);
  local_3c8 = eps;
  local_378 = vec;
  vSolveLright3(this,rhs,ridx,rn,&local_68,
                (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)eps2.m_backend.data._M_elems._24_8_,(int *)eps2.m_backend.data._M_elems._32_8_,
                (int *)eps2.m_backend._40_8_,&local_a8,rhs2,ridx2,rn2,&local_e8);
  local_3a8 = 0;
  uStack_3a0 = 0;
  local_3b8 = 0;
  uStack_3b0 = 0;
  local_398 = 0;
  local_3d0 = (this->row).perm;
  local_388 = idx;
  local_370 = this;
  if (eps3.m_backend.data._M_elems._0_8_ == 0) {
    if (*rn < 1) {
      iVar8 = 0;
    }
    else {
      lVar13 = 0;
      uVar14 = 0;
      do {
        uVar11 = (uint)uVar14;
        iVar8 = ridx[lVar13];
        local_398 = *(undefined8 *)(rhs[iVar8].m_backend.data._M_elems + 8);
        local_3b8 = *(undefined8 *)rhs[iVar8].m_backend.data._M_elems;
        uStack_3b0 = *(undefined8 *)(rhs[iVar8].m_backend.data._M_elems + 2);
        puVar2 = rhs[iVar8].m_backend.data._M_elems + 4;
        local_3a8 = *(undefined8 *)puVar2;
        uStack_3a0 = *(undefined8 *)(puVar2 + 2);
        local_408.exp = rhs[iVar8].m_backend.exp;
        local_408.neg = rhs[iVar8].m_backend.neg;
        local_408.data._M_elems._32_8_ = *(undefined8 *)(rhs[iVar8].m_backend.data._M_elems + 8);
        local_408.data._M_elems._0_8_ = *(undefined8 *)rhs[iVar8].m_backend.data._M_elems;
        local_408.data._M_elems._8_8_ = *(undefined8 *)(rhs[iVar8].m_backend.data._M_elems + 2);
        puVar2 = rhs[iVar8].m_backend.data._M_elems + 4;
        local_408.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        local_408.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
        local_408.fpclass = rhs[iVar8].m_backend.fpclass;
        local_408.prec_elem = rhs[iVar8].m_backend.prec_elem;
        local_2e8.data._M_elems._0_8_ = *(undefined8 *)(local_3c8->m_backend).data._M_elems;
        local_2e8.data._M_elems._8_8_ = *(undefined8 *)((local_3c8->m_backend).data._M_elems + 2);
        local_2e8.data._M_elems._16_8_ = *(undefined8 *)((local_3c8->m_backend).data._M_elems + 4);
        local_2e8.data._M_elems._24_8_ = *(undefined8 *)((local_3c8->m_backend).data._M_elems + 6);
        local_2e8.data._M_elems._32_8_ = *(undefined8 *)((local_3c8->m_backend).data._M_elems + 8);
        local_2e8.exp = (local_3c8->m_backend).exp;
        local_2e8.neg = (local_3c8->m_backend).neg;
        local_2e8.fpclass = (local_3c8->m_backend).fpclass;
        local_2e8.prec_elem = (local_3c8->m_backend).prec_elem;
        if ((local_408.neg == true) &&
           (local_408.data._M_elems[0] != 0 || local_408.fpclass != cpp_dec_float_finite)) {
          local_408.neg = false;
        }
        if ((local_2e8.fpclass == cpp_dec_float_NaN || local_408.fpclass == cpp_dec_float_NaN) ||
           (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_408,&local_2e8), iVar7 < 1)) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    (&rhs[iVar8].m_backend,0);
        }
        else {
          iVar8 = local_3d0[iVar8];
          uVar9 = uVar11;
          if (0 < (int)uVar11) {
            do {
              uVar16 = (uint)uVar14 - 1;
              uVar10 = uVar16 >> 1;
              uVar9 = (uint)uVar14;
              if (iVar8 <= ridx[uVar10]) break;
              ridx[uVar14] = ridx[uVar10];
              uVar14 = (ulong)uVar10;
              uVar9 = uVar10;
            } while (1 < uVar16);
          }
          uVar14 = (ulong)(uVar11 + 1);
          ridx[(int)uVar9] = iVar8;
        }
        iVar8 = (int)uVar14;
        lVar13 = lVar13 + 1;
      } while (lVar13 < *rn);
    }
    *rn = iVar8;
  }
  else {
    if (*rn < 1) {
      local_414 = 0;
    }
    else {
      local_380 = (int *)eps3.m_backend.data._M_elems._16_8_;
      lVar13 = 0;
      local_414 = 0;
      do {
        iVar8 = ridx[lVar13];
        lVar17 = (long)iVar8;
        lVar15 = lVar17 * 0x38;
        local_398 = *(undefined8 *)(rhs[lVar17].m_backend.data._M_elems + 8);
        local_3b8 = *(undefined8 *)rhs[lVar17].m_backend.data._M_elems;
        uStack_3b0 = *(undefined8 *)(rhs[lVar17].m_backend.data._M_elems + 2);
        puVar2 = rhs[lVar17].m_backend.data._M_elems + 4;
        local_3a8 = *(undefined8 *)puVar2;
        uStack_3a0 = *(undefined8 *)(puVar2 + 2);
        local_408.exp = rhs[lVar17].m_backend.exp;
        bVar3 = rhs[lVar17].m_backend.neg;
        fVar4 = rhs[lVar17].m_backend.fpclass;
        local_408.prec_elem = rhs[lVar17].m_backend.prec_elem;
        local_408.data._M_elems._32_8_ = *(undefined8 *)(rhs[lVar17].m_backend.data._M_elems + 8);
        local_408.data._M_elems._0_8_ = *(undefined8 *)rhs[lVar17].m_backend.data._M_elems;
        local_408.data._M_elems._8_8_ = *(undefined8 *)(rhs[lVar17].m_backend.data._M_elems + 2);
        puVar2 = rhs[lVar17].m_backend.data._M_elems + 4;
        local_408.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        local_408.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
        local_2a8.data._M_elems._0_8_ = *(undefined8 *)(local_3c8->m_backend).data._M_elems;
        local_2a8.data._M_elems._8_8_ = *(undefined8 *)((local_3c8->m_backend).data._M_elems + 2);
        local_2a8.data._M_elems._16_8_ = *(undefined8 *)((local_3c8->m_backend).data._M_elems + 4);
        local_2a8.data._M_elems._24_8_ = *(undefined8 *)((local_3c8->m_backend).data._M_elems + 6);
        local_2a8.data._M_elems._32_8_ = *(undefined8 *)((local_3c8->m_backend).data._M_elems + 8);
        local_2a8.exp = (local_3c8->m_backend).exp;
        local_2a8.neg = (local_3c8->m_backend).neg;
        local_2a8.fpclass = (local_3c8->m_backend).fpclass;
        local_2a8.prec_elem = (local_3c8->m_backend).prec_elem;
        local_408.fpclass = fVar4;
        local_408.neg = bVar3;
        if ((bVar3 == true) && (local_408.data._M_elems[0] != 0 || fVar4 != cpp_dec_float_finite)) {
          local_408.neg = false;
        }
        if ((local_2a8.fpclass == cpp_dec_float_NaN || fVar4 == cpp_dec_float_NaN) ||
           (local_3c0 = local_408.prec_elem, local_3bc = local_408.exp,
           iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_408,&local_2a8), iVar7 < 1)) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    (&rhs[lVar17].m_backend,0);
        }
        else {
          *local_380 = iVar8;
          iVar8 = local_3d0[lVar17];
          uVar11 = local_414;
          if (0 < (int)local_414) {
            do {
              uVar9 = uVar11 - 1;
              uVar10 = uVar9 >> 1;
              if (iVar8 <= ridx[uVar10]) break;
              ridx[uVar11] = ridx[uVar10];
              uVar11 = uVar10;
            } while (1 < uVar9);
          }
          local_380 = local_380 + 1;
          local_414 = local_414 + 1;
          ridx[(int)uVar11] = iVar8;
          *(undefined8 *)(eps3.m_backend.data._M_elems._0_8_ + 0x20 + lVar15) = local_398;
          puVar1 = (undefined8 *)(eps3.m_backend.data._M_elems._0_8_ + 0x10 + lVar15);
          *puVar1 = local_3a8;
          puVar1[1] = uStack_3a0;
          *(undefined8 *)(eps3.m_backend.data._M_elems._0_8_ + lVar15) = local_3b8;
          ((undefined8 *)(eps3.m_backend.data._M_elems._0_8_ + lVar15))[1] = uStack_3b0;
          *(int *)(eps3.m_backend.data._M_elems._0_8_ + 0x28 + lVar15) = local_3bc;
          *(bool *)(eps3.m_backend.data._M_elems._0_8_ + 0x2c + lVar15) = bVar3;
          *(fpclass_type *)(eps3.m_backend.data._M_elems._0_8_ + 0x30 + lVar15) = fVar4;
          *(int32_t *)(eps3.m_backend.data._M_elems._0_8_ + 0x34 + lVar15) = local_3c0;
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < *rn);
    }
    *rn = local_414;
    *(uint *)eps3.m_backend.data._M_elems._8_8_ = local_414;
  }
  iVar8 = 0;
  uVar12 = 0;
  if (0 < *(int *)eps2.m_backend._40_8_) {
    lVar13 = 0;
    uVar14 = 0;
    do {
      uVar11 = (uint)uVar14;
      lVar17 = (long)*(int *)(eps2.m_backend.data._M_elems._32_8_ + lVar13 * 4);
      lVar15 = lVar17 * 0x38;
      local_398 = *(undefined8 *)(eps2.m_backend.data._M_elems._24_8_ + 0x20 + lVar15);
      local_3b8 = *(undefined8 *)(eps2.m_backend.data._M_elems._24_8_ + lVar15);
      uStack_3b0 = ((undefined8 *)(eps2.m_backend.data._M_elems._24_8_ + lVar15))[1];
      puVar1 = (undefined8 *)(eps2.m_backend.data._M_elems._24_8_ + 0x10 + lVar15);
      local_3a8 = *puVar1;
      uStack_3a0 = puVar1[1];
      local_408.exp = *(int *)(eps2.m_backend.data._M_elems._24_8_ + 0x28 + lVar15);
      local_408.neg = *(bool *)(eps2.m_backend.data._M_elems._24_8_ + 0x2c + lVar15);
      local_408.data._M_elems._32_8_ =
           *(undefined8 *)(eps2.m_backend.data._M_elems._24_8_ + 0x20 + lVar15);
      local_408.data._M_elems._0_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._24_8_ + lVar15);
      local_408.data._M_elems._8_8_ =
           *(undefined8 *)((uint *)(eps2.m_backend.data._M_elems._24_8_ + lVar15) + 2);
      puVar2 = (uint *)(eps2.m_backend.data._M_elems._24_8_ + 0x10 + lVar15);
      local_408.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      local_408.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
      local_408._48_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._24_8_ + 0x30 + lVar15);
      local_328.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend.data._M_elems._0_8_;
      local_328.data._M_elems._8_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 8);
      local_328.data._M_elems._16_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x10);
      local_328.data._M_elems._24_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x18);
      local_328.data._M_elems._32_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x20);
      local_328.exp = *(int *)(eps2.m_backend.data._M_elems._0_8_ + 0x28);
      local_328.neg = *(bool *)(eps2.m_backend.data._M_elems._0_8_ + 0x2c);
      local_328._48_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x30);
      if ((local_408.neg == true) &&
         (local_408.data._M_elems[0] != 0 || local_408.fpclass != cpp_dec_float_finite)) {
        local_408.neg = false;
      }
      if ((local_328.fpclass == cpp_dec_float_NaN || local_408.fpclass == cpp_dec_float_NaN) ||
         (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_408,&local_328), iVar7 < 1)) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  ((cpp_dec_float<50U,_int,_void> *)(lVar15 + eps2.m_backend.data._M_elems._24_8_),0
                  );
      }
      else {
        iVar7 = local_3d0[lVar17];
        uVar9 = uVar11;
        if (0 < (int)uVar11) {
          do {
            uVar16 = (uint)uVar14 - 1;
            uVar10 = uVar16 >> 1;
            iVar5 = *(int *)(eps2.m_backend.data._M_elems._32_8_ + (ulong)uVar10 * 4);
            uVar9 = (uint)uVar14;
            if (iVar7 <= iVar5) break;
            *(int *)(eps2.m_backend.data._M_elems._32_8_ + uVar14 * 4) = iVar5;
            uVar14 = (ulong)uVar10;
            uVar9 = uVar10;
          } while (1 < uVar16);
        }
        uVar14 = (ulong)(uVar11 + 1);
        *(int *)(eps2.m_backend.data._M_elems._32_8_ + (long)(int)uVar9 * 4) = iVar7;
      }
      uVar12 = (undefined4)uVar14;
      lVar13 = lVar13 + 1;
    } while (lVar13 < *(int *)eps2.m_backend._40_8_);
  }
  *(undefined4 *)eps2.m_backend._40_8_ = uVar12;
  if (0 < *rn2) {
    lVar13 = 0;
    uVar14 = 0;
    do {
      uVar11 = (uint)uVar14;
      iVar8 = ridx2[lVar13];
      local_398 = *(undefined8 *)(rhs2[iVar8].m_backend.data._M_elems + 8);
      local_3b8 = *(undefined8 *)rhs2[iVar8].m_backend.data._M_elems;
      uStack_3b0 = *(undefined8 *)(rhs2[iVar8].m_backend.data._M_elems + 2);
      puVar2 = rhs2[iVar8].m_backend.data._M_elems + 4;
      local_3a8 = *(undefined8 *)puVar2;
      uStack_3a0 = *(undefined8 *)(puVar2 + 2);
      local_408.exp = rhs2[iVar8].m_backend.exp;
      local_408.neg = rhs2[iVar8].m_backend.neg;
      local_408.data._M_elems._32_8_ = *(undefined8 *)(rhs2[iVar8].m_backend.data._M_elems + 8);
      local_408.data._M_elems._0_8_ = *(undefined8 *)rhs2[iVar8].m_backend.data._M_elems;
      local_408.data._M_elems._8_8_ = *(undefined8 *)(rhs2[iVar8].m_backend.data._M_elems + 2);
      puVar2 = rhs2[iVar8].m_backend.data._M_elems + 4;
      local_408.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      local_408.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
      local_408.fpclass = rhs2[iVar8].m_backend.fpclass;
      local_408.prec_elem = rhs2[iVar8].m_backend.prec_elem;
      local_368.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend._48_8_;
      local_368.data._M_elems._8_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 8);
      local_368.data._M_elems._16_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 0x10);
      local_368.data._M_elems._24_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 0x18);
      local_368.data._M_elems._32_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 0x20);
      local_368.exp = *(int *)(eps2.m_backend._48_8_ + 0x28);
      local_368.neg = *(bool *)(eps2.m_backend._48_8_ + 0x2c);
      local_368._48_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 0x30);
      if ((local_408.neg == true) &&
         (local_408.data._M_elems[0] != 0 || local_408.fpclass != cpp_dec_float_finite)) {
        local_408.neg = false;
      }
      if ((local_368.fpclass == cpp_dec_float_NaN || local_408.fpclass == cpp_dec_float_NaN) ||
         (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_408,&local_368), iVar7 < 1)) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (&rhs2[iVar8].m_backend,0);
      }
      else {
        iVar8 = local_3d0[iVar8];
        uVar9 = uVar11;
        if (0 < (int)uVar11) {
          do {
            uVar16 = (uint)uVar14 - 1;
            uVar10 = uVar16 >> 1;
            uVar9 = (uint)uVar14;
            if (iVar8 <= ridx2[uVar10]) break;
            ridx2[uVar14] = ridx2[uVar10];
            uVar14 = (ulong)uVar10;
            uVar9 = uVar10;
          } while (1 < uVar16);
        }
        uVar14 = (ulong)(uVar11 + 1);
        ridx2[(int)uVar9] = iVar8;
      }
      iVar8 = (int)uVar14;
      lVar13 = lVar13 + 1;
    } while (lVar13 < *rn2);
  }
  this_00 = local_370;
  vec_00 = local_378;
  pnVar6 = local_3c8;
  *rn2 = iVar8;
  local_128.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)((local_3c8->m_backend).data._M_elems + 8);
  local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_3c8->m_backend).data._M_elems;
  local_128.m_backend.data._M_elems._8_8_ =
       *(undefined8 *)((local_3c8->m_backend).data._M_elems + 2);
  local_128.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)((local_3c8->m_backend).data._M_elems + 4);
  local_128.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)((local_3c8->m_backend).data._M_elems + 6);
  local_128.m_backend.exp = (local_3c8->m_backend).exp;
  local_128.m_backend.neg = (local_3c8->m_backend).neg;
  local_128.m_backend.fpclass = (local_3c8->m_backend).fpclass;
  local_128.m_backend.prec_elem = (local_3c8->m_backend).prec_elem;
  iVar8 = vSolveUright(local_370,local_378,local_388,rhs,ridx,*rn,&local_128);
  *rn = iVar8;
  local_168.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend.data._M_elems._0_8_;
  local_168.m_backend.data._M_elems._8_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 8);
  local_168.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x10);
  local_168.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x18);
  local_168.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x20);
  local_168.m_backend.exp = *(int *)(eps2.m_backend.data._M_elems._0_8_ + 0x28);
  local_168.m_backend.neg = *(bool *)(eps2.m_backend.data._M_elems._0_8_ + 0x2c);
  local_168.m_backend._48_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x30);
  iVar8 = vSolveUright(this_00,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)eps2.m_backend.data._M_elems._8_8_,
                       (int *)eps2.m_backend.data._M_elems._16_8_,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)eps2.m_backend.data._M_elems._24_8_,
                       (int *)eps2.m_backend.data._M_elems._32_8_,*(int *)eps2.m_backend._40_8_,
                       &local_168);
  *(int *)eps2.m_backend._40_8_ = iVar8;
  local_1a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend._48_8_;
  local_1a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 8);
  local_1a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 0x10);
  local_1a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 0x18);
  local_1a8.m_backend.data._M_elems._32_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 0x20);
  local_1a8.m_backend.exp = *(int *)(eps2.m_backend._48_8_ + 0x28);
  local_1a8.m_backend.neg = *(bool *)(eps2.m_backend._48_8_ + 0x2c);
  local_1a8.m_backend._48_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 0x30);
  iVar8 = vSolveUright(this_00,vec2,idx2,rhs2,ridx2,*rn2,&local_1a8);
  *rn2 = iVar8;
  if ((this_00->l).updateType == 0) {
    local_1e8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((pnVar6->m_backend).data._M_elems + 8);
    local_1e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar6->m_backend).data._M_elems;
    local_1e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((pnVar6->m_backend).data._M_elems + 2)
    ;
    local_1e8.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((pnVar6->m_backend).data._M_elems + 4);
    local_1e8.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((pnVar6->m_backend).data._M_elems + 6);
    local_1e8.m_backend.exp = (pnVar6->m_backend).exp;
    local_1e8.m_backend.neg = (pnVar6->m_backend).neg;
    local_1e8.m_backend.fpclass = (pnVar6->m_backend).fpclass;
    local_1e8.m_backend.prec_elem = (pnVar6->m_backend).prec_elem;
    iVar8 = vSolveUpdateRight(this_00,vec_00,local_388,*rn,&local_1e8);
    *rn = iVar8;
    local_228.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend.data._M_elems._0_8_;
    local_228.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 8);
    local_228.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x10);
    local_228.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x18);
    local_228.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x20);
    local_228.m_backend.exp = *(int *)(eps2.m_backend.data._M_elems._0_8_ + 0x28);
    local_228.m_backend.neg = *(bool *)(eps2.m_backend.data._M_elems._0_8_ + 0x2c);
    local_228.m_backend._48_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x30);
    iVar8 = vSolveUpdateRight(this_00,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)eps2.m_backend.data._M_elems._8_8_,
                              (int *)eps2.m_backend.data._M_elems._16_8_,
                              *(int *)eps2.m_backend._40_8_,&local_228);
    *(int *)eps2.m_backend._40_8_ = iVar8;
    local_268.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend._48_8_;
    local_268.m_backend.data._M_elems._8_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 8);
    local_268.m_backend.data._M_elems._16_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 0x10);
    local_268.m_backend.data._M_elems._24_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 0x18);
    local_268.m_backend.data._M_elems._32_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 0x20);
    local_268.m_backend.exp = *(int *)(eps2.m_backend._48_8_ + 0x28);
    local_268.m_backend.neg = *(bool *)(eps2.m_backend._48_8_ + 0x2c);
    local_268.m_backend._48_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 0x30);
    iVar8 = vSolveUpdateRight(this_00,vec2,idx2,*rn2,&local_268);
    *rn2 = iVar8;
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveRight4update3sparse(R eps, R* vec, int* idx,         /* result1 */
      R* rhs, int* ridx, int& rn,        /* rhs1    */
      R eps2, R* vec2, int* idx2,     /* result2 */
      R* rhs2, int* ridx2, int& rn2,     /* rhs2    */
      R eps3, R* vec3, int* idx3,     /* result3 */
      R* rhs3, int* ridx3, int& rn3,     /* rhs3    */
      R* forest, int* forestNum, int* forestIdx)
{
   vSolveLright3(rhs, ridx, rn, eps, rhs2, ridx2, rn2, eps2, rhs3, ridx3, rn3, eps3);
   assert(rn >= 0 && rn <= thedim);
   assert(rn2 >= 0 && rn2 <= thedim);
   assert(rn3 >= 0 && rn3 <= thedim);

   R x;
   int i, j, k;
   int* rperm = row.perm;

   /*  turn index list into a heap */
   if(forest)
   {
      int* it = forestIdx;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   for(i = j = 0; i < rn2; ++i)
   {
      k = ridx2[i];
      assert(k >= 0 && k < thedim);
      x = rhs2[k];

      if(isNotZero(x, eps2))
         enQueueMax(ridx2, &j, rperm[k]);
      else
         rhs2[k] = 0;
   }

   rn2 = j;

   for(i = j = 0; i < rn3; ++i)
   {
      k = ridx3[i];
      assert(k >= 0 && k < thedim);
      x = rhs3[k];

      if(isNotZero(x, eps3))
         enQueueMax(ridx3, &j, rperm[k]);
      else
         rhs3[k] = 0;
   }

   rn3 = j;

   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);
   rn2 = vSolveUright(vec2, idx2, rhs2, ridx2, rn2, eps2);
   rn3 = vSolveUright(vec3, idx3, rhs3, ridx3, rn3, eps3);

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = vSolveUpdateRight(vec, idx, rn, eps);
      rn2 = vSolveUpdateRight(vec2, idx2, rn2, eps2);
      rn3 = vSolveUpdateRight(vec3, idx3, rn3, eps3);
   }
}